

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  Index index;
  iterator iVar1;
  Binary *pBVar2;
  LocalGet *pLVar3;
  LocalSet *left;
  Block *expression;
  _Base_ptr p_Var4;
  Expression *value;
  Expression **ppEVar5;
  optional<wasm::Type> type;
  Builder local_40;
  Builder builder;
  LocalSet *curr_local;
  
  builder.wasm = (Module *)curr;
  iVar1 = std::
          _Rb_tree<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_int>,_std::_Select1st<std::pair<wasm::LocalSet_*const,_unsigned_int>_>,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
          ::find(*(_Rb_tree<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_int>,_std::_Select1st<std::pair<wasm::LocalSet_*const,_unsigned_int>_>,_std::less<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_int>_>_>
                   **)((long)this + 0xd8),(key_type *)&builder);
  p_Var4 = (_Base_ptr)(*(long *)((long)this + 0xd8) + 8);
  if (iVar1._M_node != p_Var4) {
    index = *(Index *)&iVar1._M_node[1]._M_parent;
    pBVar2 = Expression::cast<wasm::Binary>
                       ((Expression *)
                        ((builder.wasm)->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    value = pBVar2->left;
    if (value->_id == ConstId) {
      ppEVar5 = &pBVar2->right;
      value = pBVar2->right;
    }
    else {
      if (pBVar2->right->_id != ConstId) {
        __assert_fail("binary->right->is<Const>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                      ,0x1b0,
                      "void wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(LocalSet *)"
                     );
      }
      ppEVar5 = &pBVar2->left;
    }
    local_40.wasm = *(Module **)((long)this + 0xe0);
    pLVar3 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
    pLVar3->index = index;
    (pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
    *ppEVar5 = (Expression *)pLVar3;
    left = Builder::makeLocalSet(&local_40,index,value);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)p_Var4;
    expression = Builder::makeSequence(&local_40,(Expression *)left,(Expression *)builder.wasm,type)
    ;
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::replaceCurrent
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)this,(Expression *)expression);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }